

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQNativeClosure::Mark(SQNativeClosure *this,SQCollectable **chain)

{
  SQUnsignedInteger i;
  ulong uVar1;
  long lVar2;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < this->_noutervalues; uVar1 = uVar1 + 1) {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar2),
                 (SQCollectable_conflict **)chain);
      lVar2 = lVar2 + 0x10;
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQNativeClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQUnsignedInteger i = 0; i < _noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
    END_MARK()
}